

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * minja::strip(string *s,string *chars,bool left,bool right)

{
  ulong uVar1;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  size_type end;
  size_type start;
  string charset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  allocator<char> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  string *local_18;
  string *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_40,local_18);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_41);
  }
  if ((local_19 & 1) == 0) {
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::find_first_not_of(local_10,(ulong)local_40);
  }
  if (local_90 ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  }
  else {
    if ((local_1a & 1) == 0) {
      std::__cxx11::string::size();
    }
    else {
      std::__cxx11::string::find_last_not_of(local_10,(ulong)local_40);
    }
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static std::string strip(const std::string & s, const std::string & chars = "", bool left = true, bool right = true) {
  auto charset = chars.empty() ? " \t\n\r" : chars;
  auto start = left ? s.find_first_not_of(charset) : 0;
  if (start == std::string::npos) return "";
  auto end = right ? s.find_last_not_of(charset) : s.size() - 1;
  return s.substr(start, end - start + 1);
}